

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myentity.hpp
# Opt level: O2

void __thiscall MyEntity::MyEntity(MyEntity *this,MyEntity *obj)

{
  MetaSim::Entity::Entity(&this->super_Entity,&obj->super_Entity);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__MyEntity_0017d7a0;
  MetaSim::GEvent<MyEntity>::GEvent(&this->eventA,&obj->eventA,this);
  MetaSim::GEvent<MyEntity>::GEvent(&this->eventB,&obj->eventB,this);
  MetaSim::GEvent<MyEntity>::GEvent(&this->eventC,&obj->eventC,this);
  return;
}

Assistant:

MyEntity(const MyEntity &obj) :
        Entity(obj),
        eventA(obj.eventA, *this),
        eventB(obj.eventB, *this),
        eventC(obj.eventC, *this)
        {}